

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opts_test.c
# Opt level: O0

void basic_opts_tests(zt_unit_test *test,void *data)

{
  int iVar1;
  char *__s2;
  zt_unit_test *in_RDI;
  char *msg_18;
  char *msg_17;
  char *msg_16;
  char *msg_15;
  char *msg_14;
  char *msg_13;
  char *msg_12;
  char *msg_11;
  char *msg_10;
  char *msg_9;
  char *msg_8;
  char *msg_7;
  char *msg_6;
  char *msg_5;
  char *msg_4;
  char *msg_3;
  char *msg_2;
  char *msg_1;
  char *msg;
  zt_opt_def options [9];
  char *err;
  int ret;
  char **pargv;
  int nargc;
  int argc;
  zt_opt_error in_stack_fffffffffffffdc8;
  zt_opt_validate in_stack_fffffffffffffdd0;
  zt_opt_def_t *in_stack_fffffffffffffdd8;
  char **in_stack_fffffffffffffde0;
  int *in_stack_fffffffffffffde8;
  undefined1 local_1e8 [48];
  
  memcpy(local_1e8,&DAT_00165ec0,0x1b0);
  __s2 = zt_opt_error_str(0x16,"test");
  iVar1 = strcmp("error: { code: 22, string: \"Invalid argument: test\" }",__s2);
  if (iVar1 != 0) {
    iVar1 = zt_unit_printf(&in_RDI->error,"%s : %s:%d",
                           "strcmp(\"error: { code: 22, string: \\\"Invalid argument: test\\\" }\", err) == 0"
                           ,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/opts_test.c"
                           ,0x62);
    if (iVar1 == 0) {
      in_RDI->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)in_RDI->env,1);
  }
  zt_unit_test_add_assertion(in_RDI);
  iVar1 = zt_opt_process_args(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,
                              in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,
                              in_stack_fffffffffffffdc8);
  if (iVar1 == 0) {
    zt_unit_test_add_assertion(in_RDI);
    iVar1 = zt_unit_printf(&in_RDI->error,"%s : %s:%d","nargc < argc",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/opts_test.c"
                           ,0x67);
    if (iVar1 == 0) {
      in_RDI->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)in_RDI->env,1);
  }
  iVar1 = zt_unit_printf(&in_RDI->error,"%s : %s:%d","ret == 0",
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/opts_test.c"
                         ,0x66);
  if (iVar1 == 0) {
    in_RDI->error = (char *)0x0;
  }
  longjmp((__jmp_buf_tag *)in_RDI->env,1);
}

Assistant:

static void
basic_opts_tests(struct zt_unit_test * test, void * data UNUSED) {
    int               argc = sizeof_array(s_argv) - 1;  /* -1 for NULL */
    int               nargc = argc;
    char           ** pargv;
    int               ret;
    char            * err;

    struct zt_opt_def options[] = {
        { 'h',        "help",     NULL, zt_opt_help_stdout, "[options]",    "This help text"     },
        { 'b',        "bool",     NULL, zt_opt_bool_int,    &bool_type,     "boolean_test"       },
        { ZT_OPT_NSO, "string",   NULL, zt_opt_string,      &str,           TEST_LONG_STRING     },
        { 'f',        "func",     NULL, local_func,         &local_data,    "generic func test"  },
        { 'l',        "long",     NULL, zt_opt_long,        &long_integer,  "long integer test"  },
        { 'L',        "long2",    NULL, zt_opt_long,        &long_integer2, "long integer2 test" },
        { ZT_OPT_NSO, "flag",     NULL, zt_opt_flag_int,    &flag,          "flag test"          },
        { 'q',        ZT_OPT_NLO, NULL, zt_opt_flag_int,    &flag2,         "flag2 test"         },
        { ZT_OPT_END() }
    };

    pargv = s_argv;


    err = zt_opt_error_str(22, "test");

    /* printf("%s\n", err); */
    ZT_UNIT_ASSERT(test, strcmp("error: { code: 22, string: \"Invalid argument: test\" }", err) == 0);

    ret = zt_opt_process_args(&nargc, pargv, options, NULL, local_error);

    ZT_UNIT_ASSERT(test, ret == 0);
    ZT_UNIT_ASSERT(test, nargc < argc); /* stopped on "test_command" */

    ZT_UNIT_ASSERT(test, nargc == 8);
    ZT_UNIT_ASSERT(test, pargv[nargc] != NULL);
    ZT_UNIT_ASSERT(test, strcmp(pargv[nargc], "test_command") == 0);

    ZT_UNIT_ASSERT(test, long_integer == 1);
    ZT_UNIT_ASSERT(test, bool_type == 1);
    ZT_UNIT_ASSERT(test, str != 0 && strcmp(str, "hello") == 0);
    ZT_UNIT_ASSERT(test, flag == 1);

    ZT_UNIT_ASSERT(test, flag2 == 3);

    /* reset for next argv */
    pargv = &pargv[nargc];
    nargc = argc - nargc;

    ZT_UNIT_ASSERT(test, nargc == 5);

    ret = zt_opt_process_args(&nargc, pargv, options, NULL, NULL);
    ZT_UNIT_ASSERT(test, ret == 0);
    ZT_UNIT_ASSERT(test, nargc == 5);
    ZT_UNIT_ASSERT(test, long_integer == 2);
    ZT_UNIT_ASSERT(test, long_integer2 == 4);
    ZT_UNIT_ASSERT(test, bool_type == 0);
    ZT_UNIT_ASSERT(test, str != 0 && strcmp(str, "hello") == 0);
    ZT_UNIT_ASSERT(test, flag == 1);

    if (str) {
        zt_free(str);
    }
}